

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FASTCOVER_ctx_init(FASTCOVER_ctx_t *ctx,void *samplesBuffer,size_t *samplesSizes,
                         uint nbSamples,uint d,double splitPoint,uint f,
                         FASTCOVER_accel_t accelParams)

{
  U32 f_00;
  uint uVar1;
  uint uVar2;
  size_t *psVar3;
  U32 *pUVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  uint uVar13;
  
  uVar13 = 0;
  uVar10 = (ulong)nbSamples;
  if (nbSamples == 0) {
    uVar9 = 0;
  }
  else {
    uVar6 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 + samplesSizes[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  if (splitPoint < 1.0) {
    uVar13 = (uint)(long)((double)uVar10 * splitPoint);
  }
  uVar6 = (long)((double)uVar10 * splitPoint) & 0xffffffff;
  if (1.0 <= splitPoint) {
    uVar6 = (ulong)nbSamples;
  }
  uVar11 = uVar9;
  if (splitPoint < 1.0) {
    if ((uint)uVar6 == 0) {
      uVar11 = 0;
    }
    else {
      uVar7 = 0;
      uVar11 = 0;
      do {
        uVar11 = uVar11 + samplesSizes[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
  }
  if ((splitPoint < 1.0) && (nbSamples != uVar13)) {
    uVar7 = 0;
    do {
      uVar7 = uVar7 + 1;
    } while (nbSamples - uVar13 != uVar7);
  }
  uVar7 = 8;
  if (8 < d) {
    uVar7 = (ulong)d;
  }
  if (uVar9 < uVar7 || 0xfffffffe < uVar9) {
    sVar12 = 0xffffffffffffffb8;
    if (0 < g_displayLevel) {
      FASTCOVER_ctx_init_cold_8();
    }
  }
  else if ((uint)uVar6 < 5) {
    sVar12 = 0xffffffffffffffb8;
    if (0 < g_displayLevel) {
      FASTCOVER_ctx_init_cold_7();
    }
  }
  else if (nbSamples == uVar13) {
    sVar12 = 0xffffffffffffffb8;
    if (0 < g_displayLevel) {
      FASTCOVER_ctx_init_cold_6();
    }
  }
  else {
    ctx->d = 0;
    ctx->f = 0;
    (ctx->accelParams).finalize = 0;
    (ctx->accelParams).skip = 0;
    ctx->nbDmers = 0;
    ctx->freqs = (U32 *)0x0;
    ctx->nbTrainSamples = 0;
    ctx->nbTestSamples = 0;
    ctx->samplesSizes = (size_t *)0x0;
    ctx->nbSamples = 0;
    ctx->samples = (BYTE *)0x0;
    ctx->offsets = (size_t *)0x0;
    if (1 < g_displayLevel) {
      FASTCOVER_ctx_init_cold_1();
    }
    if (1 < g_displayLevel) {
      FASTCOVER_ctx_init_cold_2();
    }
    ctx->samples = (BYTE *)samplesBuffer;
    ctx->samplesSizes = samplesSizes;
    ctx->nbSamples = uVar10;
    ctx->nbTrainSamples = uVar6;
    ctx->nbTestSamples = (ulong)(nbSamples - uVar13);
    ctx->nbDmers = (uVar11 - uVar7) + 1;
    ctx->d = d;
    ctx->f = f;
    ctx->accelParams = accelParams;
    uVar13 = nbSamples + 1;
    psVar3 = (size_t *)calloc((ulong)uVar13,8);
    ctx->offsets = psVar3;
    if (psVar3 == (size_t *)0x0) {
      if (0 < g_displayLevel) {
        FASTCOVER_ctx_init_cold_5();
      }
      pUVar4 = ctx->freqs;
    }
    else {
      *psVar3 = 0;
      if (nbSamples < 5) {
        __assert_fail("nbSamples >= 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xbdae,
                      "size_t FASTCOVER_ctx_init(FASTCOVER_ctx_t *, const void *, const size_t *, unsigned int, unsigned int, double, unsigned int, FASTCOVER_accel_t)"
                     );
      }
      uVar10 = 2;
      if (2 < uVar13) {
        uVar10 = (ulong)uVar13;
      }
      sVar12 = *psVar3;
      lVar8 = 0;
      do {
        sVar12 = sVar12 + samplesSizes[lVar8];
        psVar3[lVar8 + 1] = sVar12;
        lVar8 = lVar8 + 1;
      } while (uVar10 - 1 != lVar8);
      pUVar4 = (U32 *)calloc(1L << ((byte)f & 0x3f),4);
      ctx->freqs = pUVar4;
      if (pUVar4 != (U32 *)0x0) {
        if (1 < g_displayLevel) {
          FASTCOVER_ctx_init_cold_3();
        }
        uVar13 = ctx->d;
        uVar2 = 8;
        if (8 < uVar13) {
          uVar2 = uVar13;
        }
        if (4 < ctx->nbTrainSamples) {
          if (ctx->nbTrainSamples <= ctx->nbSamples) {
            pUVar4 = ctx->freqs;
            f_00 = ctx->f;
            uVar1 = (ctx->accelParams).skip;
            uVar10 = 0;
            do {
              uVar9 = ctx->offsets[uVar10 + 1];
              for (sVar12 = ctx->offsets[uVar10]; sVar12 + uVar2 <= uVar9;
                  sVar12 = sVar12 + (ulong)uVar1 + 1) {
                sVar5 = FASTCOVER_hashPtrToIndex(ctx->samples + sVar12,f_00,uVar13);
                pUVar4[sVar5] = pUVar4[sVar5] + 1;
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 < ctx->nbTrainSamples);
            return 0;
          }
          __assert_fail("ctx->nbTrainSamples <= ctx->nbSamples",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xbd5b,"void FASTCOVER_computeFrequency(U32 *, const FASTCOVER_ctx_t *)");
        }
        __assert_fail("ctx->nbTrainSamples >= 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xbd5a,"void FASTCOVER_computeFrequency(U32 *, const FASTCOVER_ctx_t *)");
      }
      if (0 < g_displayLevel) {
        FASTCOVER_ctx_init_cold_4();
      }
      pUVar4 = ctx->freqs;
    }
    free(pUVar4);
    ctx->freqs = (U32 *)0x0;
    free(ctx->offsets);
    ctx->offsets = (size_t *)0x0;
    sVar12 = 0xffffffffffffffc0;
  }
  return sVar12;
}

Assistant:

static size_t
FASTCOVER_ctx_init(FASTCOVER_ctx_t* ctx,
                   const void* samplesBuffer,
                   const size_t* samplesSizes, unsigned nbSamples,
                   unsigned d, double splitPoint, unsigned f,
                   FASTCOVER_accel_t accelParams)
{
    const BYTE* const samples = (const BYTE*)samplesBuffer;
    const size_t totalSamplesSize = COVER_sum(samplesSizes, nbSamples);
    /* Split samples into testing and training sets */
    const unsigned nbTrainSamples = splitPoint < 1.0 ? (unsigned)((double)nbSamples * splitPoint) : nbSamples;
    const unsigned nbTestSamples = splitPoint < 1.0 ? nbSamples - nbTrainSamples : nbSamples;
    const size_t trainingSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes, nbTrainSamples) : totalSamplesSize;
    const size_t testSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes + nbTrainSamples, nbTestSamples) : totalSamplesSize;

    /* Checks */
    if (totalSamplesSize < MAX(d, sizeof(U64)) ||
        totalSamplesSize >= (size_t)FASTCOVER_MAX_SAMPLES_SIZE) {
        DISPLAYLEVEL(1, "Total samples size is too large (%u MB), maximum size is %u MB\n",
                    (unsigned)(totalSamplesSize >> 20), (FASTCOVER_MAX_SAMPLES_SIZE >> 20));
        return ERROR(srcSize_wrong);
    }

    /* Check if there are at least 5 training samples */
    if (nbTrainSamples < 5) {
        DISPLAYLEVEL(1, "Total number of training samples is %u and is invalid\n", nbTrainSamples);
        return ERROR(srcSize_wrong);
    }

    /* Check if there's testing sample */
    if (nbTestSamples < 1) {
        DISPLAYLEVEL(1, "Total number of testing samples is %u and is invalid.\n", nbTestSamples);
        return ERROR(srcSize_wrong);
    }

    /* Zero the context */
    memset(ctx, 0, sizeof(*ctx));
    DISPLAYLEVEL(2, "Training on %u samples of total size %u\n", nbTrainSamples,
                    (unsigned)trainingSamplesSize);
    DISPLAYLEVEL(2, "Testing on %u samples of total size %u\n", nbTestSamples,
                    (unsigned)testSamplesSize);

    ctx->samples = samples;
    ctx->samplesSizes = samplesSizes;
    ctx->nbSamples = nbSamples;
    ctx->nbTrainSamples = nbTrainSamples;
    ctx->nbTestSamples = nbTestSamples;
    ctx->nbDmers = trainingSamplesSize - MAX(d, sizeof(U64)) + 1;
    ctx->d = d;
    ctx->f = f;
    ctx->accelParams = accelParams;

    /* The offsets of each file */
    ctx->offsets = (size_t*)calloc((nbSamples + 1), sizeof(size_t));
    if (ctx->offsets == NULL) {
        DISPLAYLEVEL(1, "Failed to allocate scratch buffers \n");
        FASTCOVER_ctx_destroy(ctx);
        return ERROR(memory_allocation);
    }

    /* Fill offsets from the samplesSizes */
    {   U32 i;
        ctx->offsets[0] = 0;
        assert(nbSamples >= 5);
        for (i = 1; i <= nbSamples; ++i) {
            ctx->offsets[i] = ctx->offsets[i - 1] + samplesSizes[i - 1];
        }
    }

    /* Initialize frequency array of size 2^f */
    ctx->freqs = (U32*)calloc(((U64)1 << f), sizeof(U32));
    if (ctx->freqs == NULL) {
        DISPLAYLEVEL(1, "Failed to allocate frequency table \n");
        FASTCOVER_ctx_destroy(ctx);
        return ERROR(memory_allocation);
    }

    DISPLAYLEVEL(2, "Computing frequencies\n");
    FASTCOVER_computeFrequency(ctx->freqs, ctx);

    return 0;
}